

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *p,Vec_Int_t *vPivot,int fRemove,int fUpdate)

{
  size_t __size;
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Que_t *p_01;
  uint v;
  int iVar2;
  long lVar3;
  float *pfVar4;
  int iVar5;
  Vec_Flt_t *pVVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  
  iVar5 = vPivot->nSize;
  iVar2 = 0;
  if (1 < iVar5) {
    lVar10 = 2;
    lVar11 = 1;
    do {
      lVar7 = lVar11 + 1;
      lVar3 = (long)iVar5;
      if (lVar7 < lVar3) {
        iVar2 = vPivot->pArray[lVar11];
        lVar11 = lVar10;
        do {
          iVar5 = vPivot->pArray[lVar11];
          if (iVar5 <= iVar2) {
            __assert_fail("Lit < Lit2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcFx.c"
                          ,0x2f4,
                          "int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *, Vec_Int_t *, int, int)");
          }
          p_00 = p->vCubeFree;
          p_00->nSize = 0;
          if (iVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          Vec_IntPush(p_00,iVar2 * 2 ^ 2);
          Vec_IntPush(p->vCubeFree,iVar5 * 2 ^ 3);
          v = Hsh_VecManAdd(p->pHash,p->vCubeFree);
          pVVar6 = p->vWeights;
          uVar9 = pVVar6->nSize;
          if (fRemove == 0) {
            if (uVar9 == v) {
              lVar3 = (long)p->vCubeFree->nSize;
              if (lVar3 < 1) {
                iVar5 = 0;
              }
              else {
                lVar8 = 0;
                iVar5 = 0;
                do {
                  uVar9 = p->vCubeFree->pArray[lVar8];
                  if ((int)uVar9 < 0) {
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                  ,0x12f,"int Abc_Lit2Var(int)");
                  }
                  uVar9 = uVar9 >> 2;
                  if (p->vLevels->nSize <= (int)uVar9) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
                  }
                  iVar1 = p->vLevels->pArray[uVar9];
                  if (iVar5 <= iVar1) {
                    iVar5 = iVar1;
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar3 != lVar8);
              }
              if (799 < iVar5) {
                iVar5 = 800;
              }
              if (v == pVVar6->nCap) {
                if ((int)v < 0x10) {
                  if (pVVar6->pArray == (float *)0x0) {
                    pfVar4 = (float *)malloc(0x40);
                  }
                  else {
                    pfVar4 = (float *)realloc(pVVar6->pArray,0x40);
                  }
                  pVVar6->pArray = pfVar4;
                  pVVar6->nCap = 0x10;
                }
                else {
                  __size = (ulong)(v * 2) * 4;
                  if (pVVar6->pArray == (float *)0x0) {
                    pfVar4 = (float *)malloc(__size);
                  }
                  else {
                    pfVar4 = (float *)realloc(pVVar6->pArray,__size);
                  }
                  pVVar6->pArray = pfVar4;
                  pVVar6->nCap = v * 2;
                }
              }
              else {
                pfVar4 = pVVar6->pArray;
              }
              iVar1 = pVVar6->nSize;
              pVVar6->nSize = iVar1 + 1;
              pfVar4[iVar1] = (float)iVar5 * -0.001 + -1.1;
              p->nDivsS = p->nDivsS + 1;
              pVVar6 = p->vWeights;
              uVar9 = pVVar6->nSize;
            }
            if ((int)uVar9 <= (int)v) {
              __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcFx.c"
                            ,0x300,
                            "int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *, Vec_Int_t *, int, int)");
            }
            iVar5 = 1;
            fVar12 = 1.0;
          }
          else {
            if ((int)uVar9 <= (int)v) {
              __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcFx.c"
                            ,0x306,
                            "int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *, Vec_Int_t *, int, int)");
            }
            iVar5 = -1;
            fVar12 = -1.0;
          }
          if ((int)v < 0) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecFlt.h"
                          ,0x195,"void Vec_FltAddToEntry(Vec_Flt_t *, int, float)");
          }
          pVVar6->pArray[v] = fVar12 + pVVar6->pArray[v];
          p->nPairsS = p->nPairsS + iVar5;
          if (fUpdate != 0) {
            p_01 = p->vPrio;
            if (((int)v < p_01->nCap) && (-1 < p_01->pOrder[v])) {
              Vec_QueUpdate(p_01,v);
            }
            else if (fRemove == 0) {
              Vec_QuePush(p_01,v);
            }
          }
          lVar11 = lVar11 + 1;
          iVar5 = vPivot->nSize;
        } while ((int)lVar11 < iVar5);
        lVar3 = (long)iVar5;
      }
      lVar10 = lVar10 + 1;
      lVar11 = lVar7;
    } while (lVar7 < lVar3);
    iVar2 = ((iVar5 + -1) * iVar5) / 2;
  }
  return iVar2;
}

Assistant:

int Fx_ManCubeSingleCubeDivisors( Fx_Man_t * p, Vec_Int_t * vPivot, int fRemove, int fUpdate )
{
    int k, n, Lit, Lit2, iDiv;
    if ( Vec_IntSize(vPivot) < 2 )
        return 0;
    Vec_IntForEachEntryStart( vPivot, Lit, k, 1 )
    Vec_IntForEachEntryStart( vPivot, Lit2, n, k+1 )
    {
        assert( Lit < Lit2 );
        Vec_IntClear( p->vCubeFree );
        Vec_IntPush( p->vCubeFree, Abc_Var2Lit(Abc_LitNot(Lit), 0) );
        Vec_IntPush( p->vCubeFree, Abc_Var2Lit(Abc_LitNot(Lit2), 1) );
        iDiv = Hsh_VecManAdd( p->pHash, p->vCubeFree );
        if ( !fRemove )
        {
            if ( Vec_FltSize(p->vWeights) == iDiv )
            {
                Vec_FltPush(p->vWeights, -2 + 0.9 - 0.001 * Fx_ManComputeLevelDiv(p, p->vCubeFree));
                p->nDivsS++;
            }
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, 1 );
            p->nPairsS++;
        }
        else
        {
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, -1 );
            p->nPairsS--;
        }
        if ( fUpdate )
        {
            if ( Vec_QueIsMember(p->vPrio, iDiv) )
                Vec_QueUpdate( p->vPrio, iDiv );
            else if ( !fRemove )
                Vec_QuePush( p->vPrio, iDiv );
        }
    }
    return Vec_IntSize(vPivot) * (Vec_IntSize(vPivot) - 1) / 2;
}